

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall DyndepParserTestOutDuplicate::Run(DyndepParserTestOutDuplicate *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  string err;
  DyndepParser parser;
  char kInput [62];
  DyndepParserTestOutDuplicate *this_local;
  
  parser.env_.parent_ = (BindingEnv *)0x79645f616a6e696e;
  DyndepParser::DyndepParser
            ((DyndepParser *)((long)&err.field_2 + 8),&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  std::__cxx11::string::string((string *)local_138);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,(char *)&parser.env_.parent_,&local_159);
  bVar2 = DyndepParser::ParseTest
                    ((DyndepParser *)((long)&err.field_2 + 8),&local_158,(string *)local_138);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/dyndep_parser_test.cc"
             ,0xc1,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:3: multiple statements for \'out\'\nbuild out: dyndep\n         ^ near here"
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/dyndep_parser_test.cc"
             ,0xc4,
             "\"input:3: multiple statements for \'out\'\\n\" \"build out: dyndep\\n\" \"         ^ near here\" == err"
            );
  std::__cxx11::string::~string((string *)local_138);
  DyndepParser::~DyndepParser((DyndepParser *)((long)&err.field_2 + 8));
  return;
}

Assistant:

TEST_F(DyndepParserTest, OutDuplicate) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: dyndep\n"
"build out: dyndep\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:3: multiple statements for 'out'\n"
            "build out: dyndep\n"
            "         ^ near here", err);
}